

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O2

void __thiscall
cbtVector3::setInterpolate3(cbtVector3 *this,cbtVector3 *v0,cbtVector3 *v1,cbtScalar rt)

{
  float fVar1;
  undefined1 auVar2 [16];
  
  fVar1 = 1.0 - rt;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(rt * v1->m_floats[0])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)v0->m_floats[0]));
  this->m_floats[0] = auVar2._0_4_;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(rt * v1->m_floats[1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)v0->m_floats[1]));
  this->m_floats[1] = auVar2._0_4_;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(rt * v1->m_floats[2])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)v0->m_floats[2]));
  this->m_floats[2] = auVar2._0_4_;
  return;
}

Assistant:

SIMD_FORCE_INLINE void setInterpolate3(const cbtVector3& v0, const cbtVector3& v1, cbtScalar rt)
	{
#if defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vrt = _mm_load_ss(&rt);  //	(rt 0 0 0)
		cbtScalar s = cbtScalar(1.0) - rt;
		__m128 vs = _mm_load_ss(&s);  //	(S 0 0 0)
		vs = bt_pshufd_ps(vs, 0x80);  //	(S S S 0.0)
		__m128 r0 = _mm_mul_ps(v0.mVec128, vs);
		vrt = bt_pshufd_ps(vrt, 0x80);  //	(rt rt rt 0.0)
		__m128 r1 = _mm_mul_ps(v1.mVec128, vrt);
		__m128 tmp3 = _mm_add_ps(r0, r1);
		mVec128 = tmp3;
#elif defined(BT_USE_NEON)
		float32x4_t vl = vsubq_f32(v1.mVec128, v0.mVec128);
		vl = vmulq_n_f32(vl, rt);
		mVec128 = vaddq_f32(vl, v0.mVec128);
#else
		cbtScalar s = cbtScalar(1.0) - rt;
		m_floats[0] = s * v0.m_floats[0] + rt * v1.m_floats[0];
		m_floats[1] = s * v0.m_floats[1] + rt * v1.m_floats[1];
		m_floats[2] = s * v0.m_floats[2] + rt * v1.m_floats[2];
		//don't do the unused w component
		//		m_co[3] = s * v0[3] + rt * v1[3];
#endif
	}